

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

bool __thiscall
QColorDialogPrivate::handleColorPickingMouseButtonRelease(QColorDialogPrivate *this,QMouseEvent *e)

{
  long lVar1;
  QPoint this_00;
  undefined8 in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  QColor QVar2;
  QColorDialogPrivate *in_stack_00000018;
  SetColorMode setColorMode;
  QPointF *in_stack_ffffffffffffffc0;
  
  setColorMode = (SetColorMode)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSinglePointEvent::globalPosition((QSinglePointEvent *)0x73a643);
  this_00 = QPointF::toPoint(in_stack_ffffffffffffffc0);
  QVar2 = grabScreenColor(in_stack_00000018,(QPoint *)this);
  setCurrentColor(QVar2._0_8_,in_RDI,setColorMode);
  releaseColorPicking((QColorDialogPrivate *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QColorDialogPrivate::handleColorPickingMouseButtonRelease(QMouseEvent *e)
{
    setCurrentColor(grabScreenColor(e->globalPosition().toPoint()), SetColorAll);
    releaseColorPicking();
    return true;
}